

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O0

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_MinorAttributeMissing::
~TestreadFromDocument_MinorAttributeMissing(TestreadFromDocument_MinorAttributeMissing *this)

{
  TestreadFromDocument_MinorAttributeMissing *this_local;
  
  ~TestreadFromDocument_MinorAttributeMissing(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(readFromDocument_MinorAttributeMissing) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml = "<fix type='FIX' major='4' servicepack='0'></fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}